

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this,
          SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *other)

{
  ID IVar1;
  uint32_t uVar2;
  undefined3 uVar3;
  Parameter *pPVar4;
  Parameter *pPVar5;
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *other_local;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size);
    for (local_28 = 0;
        local_28 < (other->super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
        local_28 = local_28 + 1) {
      pPVar4 = (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr + local_28;
      pPVar5 = (other->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr + local_28;
      IVar1.id = (pPVar5->id).id;
      pPVar4->type = (TypeID)(pPVar5->type).id;
      pPVar4->id = (ID)IVar1.id;
      uVar2 = pPVar5->write_count;
      pPVar4->read_count = pPVar5->read_count;
      pPVar4->write_count = uVar2;
      uVar3 = *(undefined3 *)&pPVar5->field_0x11;
      pPVar4->alias_global_variable = pPVar5->alias_global_variable;
      *(undefined3 *)&pPVar4->field_0x11 = uVar3;
    }
    (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size =
         (other->super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}